

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::BeginBinary(Node *this,StreamWriterLE *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  StreamWriter<false,_false>::Flush(s);
  iVar1 = (*((s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IOStream[5])();
  this->start_pos = CONCAT44(extraout_var,iVar1);
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_char>(s,(uchar)(this->name)._M_string_length);
  StreamWriter<false,_false>::PutString(s,&this->name);
  StreamWriter<false,_false>::Flush(s);
  iVar1 = (*((s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IOStream[5])();
  this->property_start = CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

void FBX::Node::BeginBinary(Assimp::StreamWriterLE &s)
{
    // remember start pos so we can come back and write the end pos
    this->start_pos = s.Tell();

    // placeholders for end pos and property section info
    s.PutU4(0); // end pos
    s.PutU4(0); // number of properties
    s.PutU4(0); // total property section length

    // node name
    s.PutU1(uint8_t(name.size())); // length of node name
    s.PutString(name); // node name as raw bytes

    // property data comes after here
    this->property_start = s.Tell();
}